

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix.c++
# Opt level: O0

void __thiscall kj::UnixEventPort::~UnixEventPort(UnixEventPort *this)

{
  bool bVar1;
  UnixEventPort *this_local;
  
  (this->super_EventPort)._vptr_EventPort = (_func_int **)&PTR_wait_00c0e7f0;
  (this->super_SleepHooks)._vptr_SleepHooks = (_func_int **)&PTR_updateNextTimerEvent_00c0e830;
  bVar1 = Maybe<kj::Own<kj::UnixEventPort::ChildSet,_std::nullptr_t>_>::operator==(&this->childSet);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    (anonymous_namespace)::threadClaimedChildExits = 0;
  }
  Maybe<kj::Own<kj::UnixEventPort::ChildSet,_std::nullptr_t>_>::~Maybe(&this->childSet);
  Maybe<kj::OwnFd>::~Maybe(&this->timerFd);
  OwnFd::~OwnFd(&this->eventFd);
  OwnFd::~OwnFd(&this->epollFd);
  TimerImpl::~TimerImpl(&this->timerImpl);
  return;
}

Assistant:

UnixEventPort::~UnixEventPort() noexcept(false) {
  if (childSet != kj::none) {
    // We had claimed the exclusive right to call onChildExit(). Release that right.
    threadClaimedChildExits = false;
  }
}